

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<float_*>::TPZVec(TPZVec<float_*> *this,TPZVec<float_*> *rval)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RSI;
  undefined8 *in_RDI;
  int64_t i;
  long local_18;
  
  *in_RDI = &PTR__TPZVec_023d30c8;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  if (*(long *)(in_RSI + 0x18) == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI[2];
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    in_RDI[1] = pvVar3;
    for (local_18 = 0; local_18 < (long)in_RDI[2]; local_18 = local_18 + 1) {
      *(undefined8 *)(in_RDI[1] + local_18 * 8) =
           *(undefined8 *)(*(long *)(in_RSI + 8) + local_18 * 8);
    }
  }
  else {
    in_RDI[1] = *(undefined8 *)(in_RSI + 8);
    in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
    *(undefined8 *)(in_RSI + 8) = 0;
    *(undefined8 *)(in_RSI + 0x18) = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}